

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

void discordpp::from_json(json *j,field<discordpp::MessageActivity> *f)

{
  _Head_base<0UL,_discordpp::MessageActivity_*,_false> __ptr_00;
  undefined4 *puVar1;
  _Head_base<0UL,_discordpp::MessageActivity_*,_false> _Var2;
  undefined4 *puVar3;
  pointer *__ptr_2;
  state sVar4;
  pointer *__ptr;
  pointer *__ptr_1;
  undefined4 *local_48;
  state local_40;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_30;
  
  if (j->m_type == null) {
    _Var2._M_head_impl =
         (f->t_)._M_t.
         super___uniq_ptr_impl<discordpp::MessageActivity,_std::default_delete<discordpp::MessageActivity>_>
         ._M_t.
         super__Tuple_impl<0UL,_discordpp::MessageActivity_*,_std::default_delete<discordpp::MessageActivity>_>
         .super__Head_base<0UL,_discordpp::MessageActivity_*,_false>._M_head_impl;
    (f->t_)._M_t.
    super___uniq_ptr_impl<discordpp::MessageActivity,_std::default_delete<discordpp::MessageActivity>_>
    ._M_t.
    super__Tuple_impl<0UL,_discordpp::MessageActivity_*,_std::default_delete<discordpp::MessageActivity>_>
    .super__Head_base<0UL,_discordpp::MessageActivity_*,_false>._M_head_impl =
         (MessageActivity *)0x0;
    sVar4 = nulled_e;
    if (_Var2._M_head_impl != (MessageActivity *)0x0) {
      std::default_delete<discordpp::MessageActivity>::operator()
                ((default_delete<discordpp::MessageActivity> *)f,_Var2._M_head_impl);
    }
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<discordpp::MessageActivity,_0>(&local_48,j);
    _Var2._M_head_impl = (MessageActivity *)operator_new(0x28);
    puVar1 = local_48;
    if (local_48 == (undefined4 *)0x0) {
      puVar3 = (undefined4 *)0x0;
    }
    else {
      puVar3 = (undefined4 *)operator_new(4);
      *puVar3 = *puVar1;
    }
    *(undefined4 **)&(_Var2._M_head_impl)->type = puVar3;
    *(state *)((long)&(_Var2._M_head_impl)->type + 8) = local_40;
    field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
              ((field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&(_Var2._M_head_impl)->party_id + 8),&local_30);
    ((_Var2._M_head_impl)->party_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a360;
    __ptr_00._M_head_impl =
         (f->t_)._M_t.
         super___uniq_ptr_impl<discordpp::MessageActivity,_std::default_delete<discordpp::MessageActivity>_>
         ._M_t.
         super__Tuple_impl<0UL,_discordpp::MessageActivity_*,_std::default_delete<discordpp::MessageActivity>_>
         .super__Head_base<0UL,_discordpp::MessageActivity_*,_false>._M_head_impl;
    (f->t_)._M_t.
    super___uniq_ptr_impl<discordpp::MessageActivity,_std::default_delete<discordpp::MessageActivity>_>
    ._M_t.
    super__Tuple_impl<0UL,_discordpp::MessageActivity_*,_std::default_delete<discordpp::MessageActivity>_>
    .super__Head_base<0UL,_discordpp::MessageActivity_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (__ptr_00._M_head_impl != (MessageActivity *)0x0) {
      std::default_delete<discordpp::MessageActivity>::operator()
                ((default_delete<discordpp::MessageActivity> *)f,__ptr_00._M_head_impl);
    }
    if (local_30.t_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_30.t_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    local_30.t_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (local_48 != (undefined4 *)0x0) {
      operator_delete(local_48,4);
    }
    sVar4 = present_e;
  }
  f->s_ = sVar4;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }